

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O0

char * Abc_FrameGiaOutputMiniLutAttr(Abc_Frame_t *pAbc,void *pMiniLut)

{
  Gia_Man_t *pGia_00;
  char *pcVar1;
  Gia_Man_t *pGia;
  void *pMiniLut_local;
  Abc_Frame_t *pAbc_local;
  
  if (pAbc == (Abc_Frame_t *)0x0) {
    printf("ABC framework is not initialized by calling Abc_Start()\n");
  }
  pGia_00 = Abc_FrameReadGia(pAbc);
  if (pGia_00 == (Gia_Man_t *)0x0) {
    printf("Current network in ABC framework is not defined.\n");
  }
  pcVar1 = Gia_ManToMiniLutAttr(pGia_00,pMiniLut);
  return pcVar1;
}

Assistant:

char * Abc_FrameGiaOutputMiniLutAttr( Abc_Frame_t * pAbc, void * pMiniLut )
{
    Gia_Man_t * pGia;
    if ( pAbc == NULL )
        printf( "ABC framework is not initialized by calling Abc_Start()\n" );
    pGia = Abc_FrameReadGia( pAbc );
    if ( pGia == NULL )
        printf( "Current network in ABC framework is not defined.\n" );
    return Gia_ManToMiniLutAttr( pGia, pMiniLut );
}